

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall
QGraphicsLinearLayout::setAlignment
          (QGraphicsLinearLayout *this,QGraphicsLayoutItem *item,Alignment alignment)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<Qt::AlignmentFlag> lhs;
  QGraphicsLinearLayoutPrivate *this_00;
  QFlags<Qt::AlignmentFlag> in_EDX;
  undefined8 in_RSI;
  QGraphicsLayoutItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsLinearLayoutPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QFlagsStorage<Qt::AlignmentFlag> alignment_00;
  
  alignment_00.i = (Int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsLinearLayout *)0x9b7853);
  lhs.i = (Int)QGraphicsLinearLayout::alignment
                         ((QGraphicsLinearLayout *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  bVar2 = ::operator==((QFlags<Qt::AlignmentFlag>)lhs.i,in_EDX);
  if (!bVar2) {
    QGraphicsGridLayoutEngine::setAlignment
              ((QGraphicsGridLayoutEngine *)this_00,
               (QGraphicsLayoutItem *)CONCAT44(lhs.i,in_stack_ffffffffffffffc8),
               (Alignment)alignment_00.i);
    (*in_RDI->_vptr_QGraphicsLayoutItem[7])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsLinearLayout::setAlignment(QGraphicsLayoutItem *item, Qt::Alignment alignment)
{
    Q_D(QGraphicsLinearLayout);
    if (this->alignment(item) == alignment)
        return;
    d->engine.setAlignment(item, alignment);
    invalidate();
}